

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O3

void __thiscall test_app::~test_app(test_app *this)

{
  ~test_app(this);
  operator_delete(this);
  return;
}

Assistant:

~test_app()
	{
		release_context();
	}